

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::ClassNameResolver::HasConflictingClassName
          (ClassNameResolver *this,FileDescriptor *file,string *classname)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  EnumDescriptor *this_00;
  string *psVar4;
  ServiceDescriptor *this_01;
  Descriptor *message;
  int local_34;
  int local_30;
  int i_2;
  int i_1;
  int i;
  string *classname_local;
  FileDescriptor *file_local;
  ClassNameResolver *this_local;
  
  i_2 = 0;
  while( true ) {
    iVar3 = FileDescriptor::enum_type_count(file);
    if (iVar3 <= i_2) {
      local_30 = 0;
      while( true ) {
        iVar3 = FileDescriptor::service_count(file);
        if (iVar3 <= local_30) {
          local_34 = 0;
          while( true ) {
            iVar3 = FileDescriptor::message_type_count(file);
            if (iVar3 <= local_34) {
              return false;
            }
            message = FileDescriptor::message_type(file,local_34);
            bVar2 = anon_unknown_0::MessageHasConflictingClassName(message,classname);
            if (bVar2) break;
            local_34 = local_34 + 1;
          }
          return true;
        }
        this_01 = FileDescriptor::service(file,local_30);
        psVar4 = ServiceDescriptor::name_abi_cxx11_(this_01);
        _Var1 = std::operator==(psVar4,classname);
        if (_Var1) break;
        local_30 = local_30 + 1;
      }
      return true;
    }
    this_00 = FileDescriptor::enum_type(file,i_2);
    psVar4 = EnumDescriptor::name_abi_cxx11_(this_00);
    _Var1 = std::operator==(psVar4,classname);
    if (_Var1) break;
    i_2 = i_2 + 1;
  }
  return true;
}

Assistant:

bool ClassNameResolver::HasConflictingClassName(
    const FileDescriptor* file, const string& classname) {
  for (int i = 0; i < file->enum_type_count(); i++) {
    if (file->enum_type(i)->name() == classname) {
      return true;
    }
  }
  for (int i = 0; i < file->service_count(); i++) {
    if (file->service(i)->name() == classname) {
      return true;
    }
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageHasConflictingClassName(file->message_type(i), classname)) {
      return true;
    }
  }
  return false;
}